

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  
  uVar5 = (ulong)*(uint *)this;
  pcVar1 = *it + *(uint *)(this + 4);
  pcVar6 = pcVar1;
  if (uVar5 < 100) {
    if (*(uint *)this < 10) goto LAB_001187bc;
    uVar11 = uVar5 * 2;
    pcVar6 = pcVar1 + -1;
    pcVar1[-1] = internal::basic_data<void>::DIGITS[uVar5 * 2 + 1];
  }
  else {
    iVar9 = -1;
    uVar11 = 1;
    iVar12 = -2;
    uVar7 = 2;
    do {
      uVar4 = uVar5;
      uVar8 = (uint)uVar4;
      uVar5 = uVar4 / 100;
      iVar3 = (int)(uVar4 / 100);
      uVar14 = (ulong)((uVar8 + iVar3 * -100) * 2);
      pcVar6[-1] = internal::basic_data<void>::DIGITS[uVar14 + 1];
      lVar13 = -1;
      if ((int)(uVar11 / 3) * 3 + iVar9 == 0) {
        *(num_writer *)(pcVar6 + -2) = this[8];
        lVar13 = -2;
      }
      pcVar6[lVar13 + -1] = internal::basic_data<void>::DIGITS[uVar14];
      if ((uVar7 / 3) * 3 + iVar12 == 0) {
        *(num_writer *)(pcVar6 + lVar13 + -2) = this[8];
        lVar13 = lVar13 + -2;
      }
      else {
        lVar13 = lVar13 + -1;
      }
      pcVar6 = pcVar6 + lVar13;
      iVar9 = iVar9 + -2;
      uVar10 = (int)uVar11 + 2;
      uVar11 = (ulong)uVar10;
      iVar12 = iVar12 + -2;
      uVar7 = uVar7 + 2;
    } while (9999 < uVar8);
    if (uVar8 < 1000) {
LAB_001187bc:
      bVar2 = (byte)uVar5 | 0x30;
      goto LAB_001187f2;
    }
    uVar11 = (ulong)(uint)(iVar3 + (int)(uVar4 / 100));
    pcVar6[-1] = internal::basic_data<void>::DIGITS[uVar11 + 1];
    if (iVar9 + (uVar10 / 3) * 3 == 0) {
      *(num_writer *)(pcVar6 + -2) = this[8];
      pcVar6 = pcVar6 + -2;
    }
    else {
      pcVar6 = pcVar6 + -1;
    }
  }
  bVar2 = internal::basic_data<void>::DIGITS[uVar11 & 0xffffffff];
LAB_001187f2:
  pcVar6[-1] = bVar2;
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }